

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int gen_publickey_from_sk_ed25519_openssh_priv_data
              (LIBSSH2_SESSION *session,string_buf *decrypted,uchar **method,size_t *method_len,
              uchar **pubkeydata,size_t *pubkeydata_len,uchar *flags,char **application,
              uchar **key_handle,size_t *handle_len,EVP_PKEY **out_ctx)

{
  code *pcVar1;
  EVP_PKEY *pEVar2;
  int iVar3;
  uchar *puVar4;
  size_t sVar5;
  char *pcVar6;
  uchar *local_a0;
  uchar *handle;
  uchar *p;
  size_t tmp_len;
  size_t app_len;
  size_t key_len;
  uchar *app;
  uchar *pub_key;
  uchar *puStack_60;
  int ret;
  uchar *key;
  uchar *method_buf;
  EVP_PKEY *ctx;
  char *key_type;
  size_t *pubkeydata_len_local;
  uchar **pubkeydata_local;
  size_t *method_len_local;
  uchar **method_local;
  string_buf *decrypted_local;
  LIBSSH2_SESSION *session_local;
  
  ctx = (EVP_PKEY *)anon_var_dwarf_10e7d;
  method_buf = (uchar *)0x0;
  key = (uchar *)0x0;
  puStack_60 = (uchar *)0x0;
  pub_key._4_4_ = 0;
  app_len = 0;
  tmp_len = 0;
  p = (uchar *)0x0;
  key_type = (char *)pubkeydata_len;
  pubkeydata_len_local = (size_t *)pubkeydata;
  pubkeydata_local = (uchar **)method_len;
  method_len_local = (size_t *)method;
  method_local = &decrypted->data;
  decrypted_local = (string_buf *)session;
  iVar3 = _libssh2_get_string(decrypted,&app,(size_t *)&p);
  if ((iVar3 == 0) && (p == (uchar *)0x20)) {
    iVar3 = _libssh2_get_string((string_buf *)method_local,(uchar **)&key_len,&tmp_len);
    if (iVar3 == 0) {
      if ((flags == (uchar *)0x0) ||
         (iVar3 = _libssh2_get_byte((string_buf *)method_local,flags), iVar3 == 0)) {
        if ((key_handle != (uchar **)0x0) && (handle_len != (size_t *)0x0)) {
          local_a0 = (uchar *)0x0;
          iVar3 = _libssh2_get_string((string_buf *)method_local,&local_a0,handle_len);
          if (iVar3 != 0) {
            _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"No SK key_handle.");
            return -1;
          }
          if (*handle_len != 0) {
            puVar4 = (uchar *)(*(code *)decrypted_local->dataptr)(*handle_len,decrypted_local);
            *key_handle = puVar4;
            if (key_handle != (uchar **)0x0) {
              memcpy(*key_handle,local_a0,*handle_len);
            }
          }
        }
        method_buf = (uchar *)EVP_PKEY_new_raw_public_key(0x43f,0,app,0x20);
        if (pub_key._4_4_ == 0) {
          pcVar1 = (code *)decrypted_local->dataptr;
          sVar5 = strlen((char *)ctx);
          key = (uchar *)(*pcVar1)(sVar5,decrypted_local);
          if (key == (uchar *)0x0) {
            _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-6,
                           "Unable to allocate memory for ED25519 key");
          }
          else {
            app_len = tmp_len + 0x46;
            handle = (uchar *)_libssh2_calloc((LIBSSH2_SESSION *)decrypted_local,app_len);
            pEVar2 = ctx;
            puStack_60 = handle;
            if (handle != (uchar *)0x0) {
              sVar5 = strlen((char *)ctx);
              _libssh2_store_str(&handle,(char *)pEVar2,sVar5);
              _libssh2_store_str(&handle,(char *)app,0x20);
              _libssh2_store_str(&handle,(char *)key_len,tmp_len);
              if ((application != (char **)0x0) && (tmp_len != 0)) {
                pcVar6 = (char *)(*(code *)decrypted_local->dataptr)(tmp_len + 1,decrypted_local);
                *application = pcVar6;
                explicit_bzero(*application,tmp_len + 1);
                memcpy(*application,(void *)key_len,tmp_len);
              }
              pEVar2 = ctx;
              puVar4 = key;
              sVar5 = strlen((char *)ctx);
              memcpy(puVar4,pEVar2,sVar5);
              if (method_len_local == (size_t *)0x0) {
                (*(code *)decrypted_local[1].data)(key,decrypted_local);
              }
              else {
                *method_len_local = (size_t)key;
              }
              if (pubkeydata_local != (uchar **)0x0) {
                puVar4 = (uchar *)strlen((char *)ctx);
                *pubkeydata_local = puVar4;
              }
              if (pubkeydata_len_local == (size_t *)0x0) {
                if (puStack_60 != (uchar *)0x0) {
                  (*(code *)decrypted_local[1].data)(puStack_60,decrypted_local);
                }
              }
              else {
                *pubkeydata_len_local = (size_t)puStack_60;
              }
              if (key_type != (char *)0x0) {
                *(size_t *)key_type = app_len;
              }
              if (out_ctx == (EVP_PKEY **)0x0) {
                if (method_buf != (uchar *)0x0) {
                  EVP_PKEY_free((EVP_PKEY *)method_buf);
                }
              }
              else {
                *out_ctx = (EVP_PKEY *)method_buf;
              }
              return 0;
            }
            _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-6,
                           "Unable to allocate memory for ED25519 key");
          }
        }
        if (method_buf != (uchar *)0x0) {
          EVP_PKEY_free((EVP_PKEY *)method_buf);
        }
        if (key != (uchar *)0x0) {
          (*(code *)decrypted_local[1].data)(key,decrypted_local);
        }
        if (puStack_60 != (uchar *)0x0) {
          (*(code *)decrypted_local[1].data)(puStack_60,decrypted_local);
        }
        if ((application != (char **)0x0) && (*application != (char *)0x0)) {
          (*(code *)decrypted_local[1].data)(application,decrypted_local);
          *application = (char *)0x0;
        }
        if ((key_handle != (uchar **)0x0) && (*key_handle != (uchar *)0x0)) {
          (*(code *)decrypted_local[1].data)(key_handle,decrypted_local);
          *key_handle = (uchar *)0x0;
        }
      }
      else {
        _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"No SK flags.");
      }
    }
    else {
      _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"No SK application.");
    }
  }
  else {
    _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"Wrong public key length");
  }
  return -1;
}

Assistant:

static int
gen_publickey_from_sk_ed25519_openssh_priv_data(LIBSSH2_SESSION *session,
                                                struct string_buf *decrypted,
                                                unsigned char **method,
                                                size_t *method_len,
                                                unsigned char **pubkeydata,
                                                size_t *pubkeydata_len,
                                                unsigned char *flags,
                                                const char **application,
                                              const unsigned char **key_handle,
                                                size_t *handle_len,
                                                libssh2_ed25519_ctx **out_ctx)
{
    const char *key_type = "sk-ssh-ed25519@openssh.com";

    libssh2_ed25519_ctx *ctx = NULL;
    unsigned char *method_buf = NULL;
    unsigned char *key = NULL;
    int ret = 0;
    unsigned char *pub_key, *app;
    size_t key_len = 0, app_len = 0, tmp_len = 0;
    unsigned char *p;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing sk-ED25519 keys from private key data"));

    if(_libssh2_get_string(decrypted, &pub_key, &tmp_len) ||
       tmp_len != LIBSSH2_ED25519_KEY_LEN) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "Wrong public key length");
        return -1;
    }

    if(_libssh2_get_string(decrypted, &app, &app_len)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "No SK application.");
        return -1;
    }

    if(flags && _libssh2_get_byte(decrypted, flags)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "No SK flags.");
        return -1;
    }

    if(key_handle && handle_len) {
        unsigned char *handle = NULL;
        if(_libssh2_get_string(decrypted, &handle, handle_len)) {
            _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                           "No SK key_handle.");
            return -1;
        }

        if(*handle_len > 0) {
            *key_handle = LIBSSH2_ALLOC(session, *handle_len);

            if(key_handle) {
                memcpy((void *)LIBSSH2_UNCONST(*key_handle),
                       handle, *handle_len);
            }
        }
    }

    ctx = EVP_PKEY_new_raw_public_key(EVP_PKEY_ED25519, NULL,
                                      (const unsigned char *)pub_key,
                                      LIBSSH2_ED25519_KEY_LEN);

    if(ret == 0) {
        _libssh2_debug((session,
                       LIBSSH2_TRACE_AUTH,
                       "Computing public key from ED25519 "
                       "private key envelope"));

        /* sk-ssh-ed25519@openssh.com. */
        method_buf = LIBSSH2_ALLOC(session, strlen(key_type));
        if(!method_buf) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for ED25519 key");
            goto clean_exit;
        }

        /* Key form is: type_len(4) + type(26) + pub_key_len(4) +
           pub_key(32) + application_len(4) + application(X). */
        key_len = LIBSSH2_ED25519_KEY_LEN + 38 + app_len;
        key = LIBSSH2_CALLOC(session, key_len);
        if(!key) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for ED25519 key");
            goto clean_exit;
        }

        p = key;

        _libssh2_store_str(&p, key_type, strlen(key_type));
        _libssh2_store_str(&p, (const char *)pub_key, LIBSSH2_ED25519_KEY_LEN);
        _libssh2_store_str(&p, (const char *)app, app_len);

        if(application && app_len > 0) {
            *application = LIBSSH2_ALLOC(session, app_len + 1);
            _libssh2_explicit_zero((void *)LIBSSH2_UNCONST(*application),
                                   app_len + 1);
            memcpy((void *)LIBSSH2_UNCONST(*application), app, app_len);
        }

        memcpy(method_buf, key_type, strlen(key_type));

        if(method)
            *method = method_buf;
        else
            LIBSSH2_FREE(session, method_buf);

        if(method_len)
            *method_len = strlen(key_type);

        if(pubkeydata)
            *pubkeydata = key;
        else if(key)
            LIBSSH2_FREE(session, key);

        if(pubkeydata_len)
            *pubkeydata_len = key_len;

        if(out_ctx)
            *out_ctx = ctx;
        else if(ctx)
            _libssh2_ed25519_free(ctx);

        return 0;
    }

clean_exit:

    if(ctx)
        _libssh2_ed25519_free(ctx);

    if(method_buf)
        LIBSSH2_FREE(session, method_buf);

    if(key)
        LIBSSH2_FREE(session, key);

    if(application && *application) {
        LIBSSH2_FREE(session, (void *)application);
        *application = NULL;
    }

    if(key_handle && *key_handle) {
        LIBSSH2_FREE(session, (void *)key_handle);
        *key_handle = NULL;
    }

    return -1;
}